

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O0

void init_fdtd_3D_medium(fdtd3D *fdtd,init_medium_fun_3D permeability_invR,
                        init_medium_fun_3D permittivity_invR,void *user)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 in_RCX;
  code *in_RDX;
  code *in_RSI;
  double *in_RDI;
  double dVar7;
  uintmax_t k;
  float_type posZ;
  uintmax_t j;
  float_type posY;
  uintmax_t i;
  float_type posX;
  float_type_0__0_ *permeability_inv;
  float_type_0__0_ *permittivity_inv;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar1 = in_RDI[0x32];
  dVar2 = in_RDI[0x33];
  dVar3 = in_RDI[10];
  dVar4 = in_RDI[0x32];
  dVar5 = in_RDI[0x33];
  dVar6 = in_RDI[0xb];
  local_38 = 0.0;
  for (local_40 = 0.0; (ulong)local_40 < (ulong)in_RDI[0x31];
      local_40 = (double)((long)local_40 + 1)) {
    local_48 = 0.0;
    for (local_50 = 0.0; (ulong)local_50 < (ulong)in_RDI[0x32];
        local_50 = (double)((long)local_50 + 1)) {
      local_58 = 0.0;
      for (local_60 = 0.0; (ulong)local_60 < (ulong)in_RDI[0x33];
          local_60 = (double)((long)local_60 + 1)) {
        dVar7 = (double)(*in_RSI)(local_38,local_48,local_58,in_RCX);
        *(double *)
         ((long)dVar6 + (long)local_40 * (long)dVar4 * (long)dVar5 * 8 +
          (long)dVar5 * (long)local_50 * 8 + (long)local_60 * 8) =
             1.0 / (dVar7 * 1.2566370614359173e-06);
        dVar7 = (double)(*in_RDX)(local_38,local_48,local_58,in_RCX);
        *(double *)
         ((long)dVar3 + (long)local_40 * (long)dVar1 * (long)dVar2 * 8 +
          (long)dVar2 * (long)local_50 * 8 + (long)local_60 * 8) =
             1.0 / (dVar7 * 8.85418781762039e-12);
        local_58 = in_RDI[2] + local_58;
      }
      local_48 = in_RDI[1] + local_48;
    }
    local_38 = *in_RDI + local_38;
  }
  return;
}

Assistant:

void init_fdtd_3D_medium(struct fdtd3D *fdtd,
                         init_medium_fun_3D permeability_invR,
                         init_medium_fun_3D permittivity_invR, void *user) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permittivity_inv, fdtd->permittivity_inv);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permeability_inv, fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      float_type posZ = float_cst(0.);
      for (uintmax_t k = 0; k < fdtd->sizeZ; ++k, posZ += fdtd->dz) {
        permeability_inv[i][j][k] =
            float_cst(1.) / (permeability_invR(posX, posY, posZ, user) * mu0);
        permittivity_inv[i][j][k] =
            float_cst(1.) / (permittivity_invR(posX, posY, posZ, user) * eps0);
      }
    }
  }
}